

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeSwitch(Ref input)

{
  Value *pVVar1;
  Ref RVar2;
  Ref local_20;
  Ref local_18;
  Ref input_local;
  
  local_18.inst = input.inst;
  local_20 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_20);
  RVar2 = makeRawString((IString *)&SWITCH);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  pVVar1 = Value::push_back(pVVar1,local_18);
  RVar2 = makeRawArray(0);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  Ref::Ref(&input_local,pVVar1);
  return (Ref)input_local.inst;
}

Assistant:

static Ref makeSwitch(Ref input) {
    return &makeRawArray(3)
              ->push_back(makeRawString(SWITCH))
              .push_back(input)
              .push_back(makeRawArray());
  }